

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

double fas154_seas(double *b,int pq,void *params)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  double phi;
  double *__ptr;
  int iVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  int ip;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  double extraout_XMM0_Qa;
  double local_98;
  double ssq;
  double sumlog;
  long local_80;
  int local_78;
  int local_74;
  int nit;
  int iter;
  ulong local_68;
  double *local_60;
  double *local_58;
  long local_50;
  double *local_48;
  double *local_40;
  double local_38;
  
  ssq = 0.0;
  local_98 = 0.0;
  local_38 = (double)(ulong)*params;
  uVar1 = *(uint *)((long)params + 8);
  iVar11 = *(int *)((long)params + 0xc);
  lVar13 = (long)iVar11;
  local_68 = (ulong)*(uint *)((long)params + 0x10);
  _nit = (ulong)*(uint *)((long)params + 0x18);
  iVar2 = *(int *)((long)params + 0x1c);
  local_50 = (long)iVar2;
  uVar3 = *(uint *)((long)params + 0x28);
  local_80 = (long)*(int *)((long)params + 0x50);
  sVar12 = local_50 * 8;
  sumlog = (double)malloc(sVar12);
  local_48 = (double *)malloc(sVar12);
  local_40 = (double *)sVar12;
  local_60 = (double *)malloc(sVar12);
  sVar12 = (long)(((iVar2 + 1) * iVar2) / 2) << 3;
  local_58 = (double *)malloc(sVar12);
  pdVar5 = (double *)malloc(sVar12);
  pdVar7 = local_40;
  if (0 < local_50) {
    memset((void *)sumlog,0,(size_t)local_40);
    memset(local_48,0,(size_t)pdVar7);
  }
  phi = sumlog;
  if (0 < SUB84(local_38,0)) {
    memcpy((void *)sumlog,b,(long)local_38 * 8);
  }
  if (0 < (int)uVar1) {
    memcpy(local_48,b + local_38._0_4_,(ulong)uVar1 * 8);
  }
  iVar10 = (int)local_68;
  iVar2 = SUB84(local_38,0);
  if (0 < iVar10) {
    lVar6 = (long)phi + lVar13 * 8;
    uVar8 = 0;
    do {
      dVar15 = b[(long)(int)(iVar2 + uVar1) + uVar8];
      uVar8 = uVar8 + 1;
      *(double *)((long)phi + -8 + uVar8 * lVar13 * 8) =
           *(double *)((long)phi + -8 + uVar8 * lVar13 * 8) + dVar15;
      if (0 < iVar2) {
        uVar9 = 0;
        do {
          *(double *)(lVar6 + uVar9 * 8) = *(double *)(lVar6 + uVar9 * 8) - b[uVar9] * dVar15;
          uVar9 = uVar9 + 1;
        } while (((ulong)local_38 & 0xffffffff) != uVar9);
      }
      lVar6 = lVar6 + lVar13 * 8;
    } while (uVar8 != local_68);
  }
  iVar4 = (int)_nit;
  local_50 = (long)(int)uVar3;
  if (0 < iVar4) {
    uVar8 = 0;
    pdVar7 = local_48;
    do {
      pdVar7 = pdVar7 + lVar13;
      dVar15 = b[(long)(int)(uVar1 + iVar2 + iVar10) + uVar8];
      uVar8 = uVar8 + 1;
      local_48[uVar8 * lVar13 + -1] = local_48[uVar8 * lVar13 + -1] + dVar15;
      if (0 < (int)uVar1) {
        uVar9 = 0;
        do {
          pdVar7[uVar9] = b[(long)iVar2 + uVar9] * dVar15 + pdVar7[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar1 != uVar9);
      }
    } while (uVar8 != _nit);
  }
  ip = iVar10 * iVar11 + iVar2;
  iVar11 = iVar4 * iVar11 + uVar1;
  if (0 < (int)uVar3 && *(int *)((long)params + 0x2c) == 1) {
    uVar8 = 0;
    do {
      *(double *)((long)params + uVar8 * 8 + local_80 * 8 + 0x58) =
           *(double *)((long)params + uVar8 * 8 + (local_80 + (long)(int)uVar3 * 2) * 8 + 0x58) -
           b[(int)(iVar10 + iVar4 + uVar1 + iVar2)];
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  bVar14 = ip != 1 || iVar11 != 0;
  local_40 = pdVar5;
  if (bVar14) {
    starma(ip,iVar11,(double *)phi,local_48,local_60,local_58,pdVar5);
    dVar15 = extraout_XMM0_Qa;
  }
  else {
    *pdVar5 = 1.0;
    *local_60 = 0.0;
    dVar15 = *(double *)phi * *(double *)phi;
    *local_58 = 1.0 / (1.0 - dVar15);
  }
  __ptr = local_40;
  pdVar5 = local_58;
  pdVar7 = local_60;
  local_38 = (double)(ulong)bVar14;
  local_78 = 0;
  karma(ip,iVar11,(double *)phi,local_48,local_60,local_58,local_40,(int)local_50,
        (double *)((long)params + local_80 * 8 + 0x58),
        (double *)((long)params + local_50 * 8 + local_80 * 8 + 0x58),&ssq,&local_98,(uint)bVar14,
        dVar15,&local_74,&local_78);
  *(double *)((long)params + 0x40) = local_98;
  local_38 = ssq / (double)local_74;
  dVar15 = log(local_98 / (double)local_74);
  local_38 = (dVar15 + local_38) * 0.5;
  *(double *)((long)params + 0x48) = local_38;
  free((void *)phi);
  free(local_48);
  free(pdVar7);
  free(pdVar5);
  free(__ptr);
  return local_38;
}

Assistant:

double fas154_seas(double *b, int pq, void *params) {
	double value, ssq, sumlog, delta;
	int p, q, ps, qs,s,offset;
	int ip, iq, ir, i,j, np, ifault, N, iupd, nit, iter;
	double *phi, *theta, *A, *P, *V;

	value = ssq = sumlog = 0.0;
	alik_seas_object obj = (alik_seas_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);
	ir = obj->r;
	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	offset = obj->offset;
	np = (ir * (ir + 1)) / 2;

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);

	for (i = 0; i < ir; ++i) {
		phi[i] = 0.0;
		theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}
	/*
	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}
	*/

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset + i] = obj->x[offset + 2 * N + i] - b[p + q + ps + qs];
		}
	}
	
	//mdisplay(phi, 1, ir);
	//mdisplay(theta, 1, ir);
	iupd = 0;
	//mdisplay(b, 1, pq);

	if (ip == 1 && iq == 0) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}

	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x + offset, obj->x + offset + N, &sumlog, &ssq, iupd, delta, &iter, &nit);
	obj->ssq = ssq;
	//mdisplay(V, 1, np);

	value = 0.5 * (sumlog / (double)iter + log(ssq / (double)iter));
	obj->loglik = value;
	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	return value;
}